

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  BtShared *pBVar1;
  int iVar2;
  u32 uVar3;
  
  if (((p->sharable != '\0') || (p->inTrans == '\0')) || (wrflag != 0 && p->inTrans == '\x01')) {
    iVar2 = btreeBeginTrans(p,wrflag,pSchemaVersion);
    return iVar2;
  }
  pBVar1 = p->pBt;
  if (pSchemaVersion != (int *)0x0) {
    uVar3 = sqlite3Get4byte(pBVar1->pPage1->aData + 0x28);
    *pSchemaVersion = uVar3;
  }
  if (wrflag != 0) {
    iVar2 = sqlite3PagerOpenSavepoint(pBVar1->pPager,p->db->nSavepoint);
    return iVar2;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt;
  if( p->sharable
   || p->inTrans==TRANS_NONE
   || (p->inTrans==TRANS_READ && wrflag!=0)
  ){
    return btreeBeginTrans(p,wrflag,pSchemaVersion);
  }
  pBt = p->pBt;
  if( pSchemaVersion ){
    *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
  }
  if( wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    return sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }else{
    return SQLITE_OK;
  }
}